

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# san.c
# Opt level: O1

move_t SAN_parse_move(chess_state_t *state,char *san)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  byte bVar15;
  uint uVar16;
  bool bVar17;
  move_t moves [256];
  byte local_440;
  move_t local_438 [258];
  
  sVar6 = strlen(san);
  uVar16 = (uint)sVar6;
  uVar4 = STATE_generate_moves_simple(state,local_438);
  bVar15 = 1;
  switch(*san) {
  case 'K':
  case 'O':
    uVar14 = 5;
    bVar17 = true;
    local_440 = 0;
    bVar15 = 1;
    goto LAB_00104bd1;
  case 'L':
  case 'M':
  case 'P':
    goto switchD_00104b7d_caseD_4c;
  case 'N':
    uVar14 = 1;
    break;
  case 'Q':
    uVar14 = 4;
    break;
  case 'R':
    uVar14 = 3;
    break;
  default:
    if (*san == 'B') {
      uVar14 = 2;
      break;
    }
    goto switchD_00104b7d_caseD_4c;
  }
  bVar17 = false;
  local_440 = 0;
LAB_00104bd1:
  if (bVar17) {
    iVar5 = strncmp(san,"O-O-O",5);
    if (iVar5 == 0) {
      if ((int)uVar4 < 1) {
        return 0;
      }
      uVar11 = 0;
      do {
        if ((local_438[uVar11] & 0x3c0000) == 0xc0000) {
          return local_438[uVar11];
        }
        uVar11 = uVar11 + 1;
      } while (uVar4 != uVar11);
      return 0;
    }
    iVar5 = strncmp(san,"O-O",3);
    if (iVar5 == 0) {
      if ((int)uVar4 < 1) {
        return 0;
      }
      uVar11 = 0;
      do {
        if ((local_438[uVar11] & 0x3c0000) == 0x80000) {
          return local_438[uVar11];
        }
        uVar11 = uVar11 + 1;
      } while (uVar4 != uVar11);
      return 0;
    }
  }
  pcVar7 = strchr(san,0x78);
  uVar9 = uVar16;
  if ((5 < (int)uVar16 & local_440 & pcVar7 != (char *)0x0) == 1) {
    iVar5 = strcmp(san + ((ulong)(uVar16 & 0x7fffffff) - 5)," e.p.");
    uVar9 = uVar16 - 5;
    if (iVar5 != 0) {
      uVar9 = uVar16;
    }
  }
  if (san[(long)(int)uVar9 + -1] == '+') {
    uVar9 = uVar9 - 1;
  }
  if (san[(long)(int)uVar9 + -1] == '#') {
    uVar9 = uVar9 - 1;
  }
  uVar16 = 0;
  if ((local_440 != 0) && (pcVar8 = strchr(san,0x3d), pcVar8 != (char *)0x0)) {
    bVar1 = san[(long)(int)uVar9 + -1];
    if (bVar1 < 0x51) {
      if (bVar1 == 0x42) {
        uVar16 = 2;
      }
      else {
        uVar16 = 1;
        if (bVar1 != 0x4e) {
          return 0;
        }
      }
    }
    else if (bVar1 == 0x51) {
      uVar16 = 4;
    }
    else {
      if (bVar1 != 0x52) {
        return 0;
      }
      uVar16 = 3;
    }
    uVar9 = uVar9 - 2;
  }
  iVar5 = uVar9 - 2;
  if (pcVar7 != (char *)0x0) {
    iVar5 = uVar9 - 3;
  }
  uVar13 = 0xffffffff;
  if ((byte)(bVar15 & 1 < iVar5 | 0 < iVar5 & local_440) == 1) {
    uVar10 = iVar5 - (uint)(local_440 ^ 1);
    uVar12 = 0xffffffff;
    if (0 < (int)uVar10) {
      uVar11 = 0;
      uVar12 = 0xffffffff;
      do {
        cVar2 = san[uVar11 + (local_440 ^ 1)];
        if ((byte)(cVar2 + 0x9fU) < 8) {
          uVar12 = (int)cVar2 - 0x61;
        }
        else if ((byte)(cVar2 - 0x31U) < 8) {
          uVar13 = (int)cVar2 - 0x31;
        }
        uVar11 = uVar11 + 1;
      } while (uVar10 != uVar11);
    }
  }
  else {
    uVar12 = 0xffffffff;
  }
  if ((int)uVar4 < 1) {
    return 0;
  }
  uVar11 = 0;
  uVar10 = 0;
  iVar5 = 0;
  do {
    uVar3 = local_438[uVar11];
    if ((((((uVar3 >> 0xc & 7) == uVar14) && ((pcVar7 != (char *)0x0) != ((uVar3 >> 0x14 & 1) == 0))
          ) && ((uVar16 == 0 || (uVar16 == ((uVar3 >> 0x12 & 0xb) - 7 & (int)(uVar3 << 10) >> 0x1f))
                ))) &&
        ((uVar3 >> 6 & 0x3f) ==
         ((int)san[(long)(int)uVar9 + -2] + san[(long)(int)uVar9 + -1] * 8) - 0x1e9U)) &&
       ((((int)uVar13 < 0 || ((uVar3 >> 3 & 7) == uVar13)) &&
        (bVar17 = (uVar3 & 7) == uVar12, iVar5 = iVar5 + (uint)(bVar17 || (int)uVar12 < 0),
        bVar17 || (int)uVar12 < 0)))) {
      uVar10 = uVar3;
    }
    uVar11 = uVar11 + 1;
  } while (uVar4 != uVar11);
  if (iVar5 == 1) {
    return uVar10;
  }
  return 0;
switchD_00104b7d_caseD_4c:
  bVar17 = false;
  local_440 = 1;
  bVar15 = 0;
  uVar14 = 0;
  goto LAB_00104bd1;
}

Assistant:

move_t SAN_parse_move(const chess_state_t *state, const char *san)
{
    move_t moves[256];
    move_t candidate = 0;
    move_t num_candidates = 0;
    int num_moves;
    int i;
    int len;
    int is_capture = 0;
    int promotion_type = 0;
    int type = PAWN;
    int pos_to = 0;
    int rank = -1;
    int file = -1;
    
    len = (int)strlen(san);
    
    /* Generate all possible moves */
    num_moves = STATE_generate_moves_simple(state, moves);
    
    /* What type of piece is moving? */
    switch(san[0]) {
    case 'N':
        type = KNIGHT;
        break;
    case 'B':
        type = BISHOP;
        break;
    case 'R':
        type = ROOK;
        break;
    case 'Q':
        type = QUEEN;
        break;
    case 'K':
    case 'O':
        type = KING;
        break;
    default:
        type = PAWN;
        break;
    }
    
    if(type == KING) {
        /* Is this a kingside castling? */
        if(strncmp(san, "O-O-O", 5) == 0) {
            for(i = 0; i < num_moves; i++) {
                if(MOVE_GET_SPECIAL_FLAGS(moves[i]) == MOVE_QUEEN_CASTLE) {
                    return moves[i];
                }
            }
            /* Failure */
            return 0;
        }
        
        /* Is this a queenside castling? */
        if(strncmp(san, "O-O", 3) == 0) {
            for(i = 0; i < num_moves; i++) {
                if(MOVE_GET_SPECIAL_FLAGS(moves[i]) == MOVE_KING_CASTLE) {
                    return moves[i];
                }
            }
            /* Failure */
            return 0;
        }
    }
    
    /* Is this move a capture? */
    is_capture = (strchr(san, 'x') != 0);
    
    /* Is this move an en passant capture? */
    if(type == PAWN && is_capture && len > 5) {
        if(strcmp(san+len-5, " e.p.") == 0) {
            len -= 5;
        }
    }
    
    /* Is this move a check? */
    if(san[len-1] == '+') {
        len -= 1;
    }

    /* Is this move a check mate? */
    if(san[len-1] == '#') {
        len -= 1;
    }
    
    /* Is this move a pawn promotion? */
    if(type == PAWN && strchr(san, '=')) {
        /* To what piece? */
        switch(san[len-1]) {
        case 'N':
            promotion_type = KNIGHT;
            break;
        case 'B':
            promotion_type = BISHOP;
            break;
        case 'R':
            promotion_type = ROOK;
            break;
        case 'Q':
            promotion_type = QUEEN;
            break;
        default:
        /* Failure */
            return 0;
        }
        
        len -= 2;
    }
    
    /* To what square is the piece moving? */
    pos_to = (san[len-2]-'a') + (san[len-1]-'1') * 8;
    len -= 2;
    
    if(is_capture) {
        len -= 1;
    }
    
    /* Check from file/rank/square */
    if((type == PAWN && len > 0 ) || (type != PAWN && len > 1)) {
        const char *s = san;
        if(type != PAWN) {
            s += 1;
            len -= 1;
        }
        
        for(i = 0; i < len; i++) {
            if(s[i] >= 'a' && s[i] <= 'h') {
                file = s[i] - 'a';
            } else if(s[i] >= '1' && s[i] <= '8') {
                rank = s[i] - '1';
            }
        }
    }

    /* Find candidate move */
    for(i = 0; i < num_moves; i++) {
        int pos_from;
        move_t move = moves[i];
        
        if(MOVE_GET_TYPE(move) != type) continue;
        if((MOVE_IS_CAPTURE(move) != 0) != is_capture) continue;
        if(promotion_type && promotion_type != MOVE_PROMOTION_TYPE(move)) continue;
        if(MOVE_GET_POS_TO(move) != pos_to) continue;
        pos_from = MOVE_GET_POS_FROM(move);
        if(rank >= 0 && pos_from / 8 != rank) continue;
        if(file >= 0 && pos_from % 8 != file) continue;

        num_candidates++;
        candidate = move;
    }

    if(num_candidates == 1) {
        return candidate;
    } else {
        /* Failure */
        return 0;
    }
}